

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O3

FT_Error PCF_Glyph_Load(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  short sVar1;
  FT_Face pFVar2;
  FT_Stream stream;
  uchar *puVar3;
  uint uVar4;
  FT_Error FVar5;
  ushort *puVar6;
  uint *puVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  FT_Bitmap_Size *pFVar12;
  long lVar13;
  FT_Error FVar14;
  int iVar15;
  ulong uVar16;
  
  pFVar2 = size->face;
  if (pFVar2 == (FT_Face)0x0) {
    FVar5 = 0x23;
  }
  else {
    FVar5 = 6;
    if (glyph_index < (uint)pFVar2->num_glyphs) {
      stream = pFVar2->stream;
      lVar11 = pFVar2[2].num_glyphs;
      uVar16 = (ulong)glyph_index;
      iVar15 = (int)*(short *)(lVar11 + 6 + uVar16 * 0x18);
      uVar4 = *(short *)(lVar11 + 8 + uVar16 * 0x18) + iVar15;
      (slot->bitmap).rows = uVar4;
      iVar9 = (int)*(short *)(lVar11 + uVar16 * 0x18);
      lVar13 = (long)*(short *)(lVar11 + 2 + uVar16 * 0x18) - (long)iVar9;
      uVar10 = (uint)lVar13;
      (slot->bitmap).width = uVar10;
      (slot->bitmap).num_grays = 1;
      (slot->bitmap).pixel_mode = '\x01';
      bVar8 = *(byte *)&pFVar2[2].available_sizes & 3;
      FVar5 = 3;
      if ((1 << bVar8) - 1U < 8) {
        switch(bVar8) {
        case 0:
          uVar10 = uVar10 + 7 >> 3;
          break;
        case 1:
          uVar10 = uVar10 + 0xf >> 3 & 0xfffffffe;
          break;
        case 2:
          uVar10 = uVar10 + 0x1f >> 3 & 0xfffffffc;
          break;
        case 3:
          uVar10 = uVar10 + 0x3f >> 3 & 0xfffffff8;
        }
        lVar11 = lVar11 + uVar16 * 0x18;
        (slot->bitmap).pitch = uVar10;
        slot->format = FT_GLYPH_FORMAT_BITMAP;
        slot->bitmap_left = iVar9;
        slot->bitmap_top = iVar15;
        sVar1 = *(short *)(lVar11 + 4);
        (slot->metrics).horiBearingX = (long)iVar9 << 6;
        iVar9 = (int)sVar1 << 6;
        (slot->metrics).horiBearingY = CONCAT44(-(uint)(iVar15 << 6 < 0),iVar15 << 6);
        *(int *)&(slot->metrics).vertBearingX = iVar9;
        *(uint *)((long)&(slot->metrics).vertBearingX + 4) = -(uint)(iVar9 < 0);
        (slot->metrics).width = lVar13 * 0x40;
        (slot->metrics).height = (ulong)(uVar4 * 0x40);
        ft_synthesize_vertical_metrics
                  (&slot->metrics,
                   (*(long *)&pFVar2[1].max_advance_width + *(long *)&pFVar2[1].units_per_EM) * 0x40
                  );
        FVar14 = 0;
        FVar5 = 0;
        if (((uint)load_flags >> 0x16 & 1) == 0) {
          uVar16 = (ulong)(slot->bitmap).rows * (long)(slot->bitmap).pitch;
          FVar5 = ft_glyphslot_alloc_bitmap(slot,uVar16);
          if (((FVar5 == 0) &&
              (FVar5 = FT_Stream_Seek(stream,*(FT_ULong *)(lVar11 + 0x10)), FVar5 == 0)) &&
             (FVar5 = FT_Stream_Read(stream,(slot->bitmap).buffer,uVar16), FVar5 == 0)) {
            pFVar12 = pFVar2[2].available_sizes;
            if (uVar16 != 0 && (char)(((uint)pFVar12 & 8) >> 3) == '\0') {
              puVar3 = (slot->bitmap).buffer;
              lVar11 = 0;
              do {
                bVar8 = puVar3[lVar11];
                bVar8 = bVar8 << 4 | bVar8 >> 4;
                bVar8 = bVar8 >> 2 & 0x33 | (bVar8 & 0x33) << 2;
                puVar3[lVar11] = bVar8 >> 1 & 0x55 | (bVar8 & 0x55) * '\x02';
                lVar11 = lVar11 + 1;
              } while (uVar16 - lVar11 != 0);
              pFVar12 = pFVar2[2].available_sizes;
            }
            FVar5 = 0;
            if ((((uint)((ulong)pFVar12 >> 3) & 0x1fffffff ^
                 (uint)((ulong)pFVar12 >> 2) & 0x3fffffff) & 1) != 0) {
              iVar9 = 1 << ((byte)((ulong)pFVar12 >> 4) & 3);
              FVar5 = FVar14;
              if (iVar9 == 4) {
                if (3 < uVar16) {
                  puVar7 = (uint *)(slot->bitmap).buffer;
                  do {
                    uVar4 = *puVar7;
                    *puVar7 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                              uVar4 << 0x18;
                    uVar16 = uVar16 - 4;
                    puVar7 = puVar7 + 1;
                  } while (3 < uVar16);
                }
              }
              else if ((iVar9 == 2) && (1 < uVar16)) {
                puVar6 = (ushort *)(slot->bitmap).buffer;
                do {
                  *puVar6 = *puVar6 << 8 | *puVar6 >> 8;
                  uVar16 = uVar16 - 2;
                  puVar6 = puVar6 + 1;
                } while (1 < uVar16);
              }
            }
          }
        }
      }
    }
  }
  return FVar5;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  PCF_Glyph_Load( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    PCF_Face    face   = (PCF_Face)FT_SIZE_FACE( size );
    FT_Stream   stream;
    FT_Error    error  = FT_Err_Ok;
    FT_Bitmap*  bitmap = &slot->bitmap;
    PCF_Metric  metric;
    FT_ULong    bytes;


    FT_TRACE1(( "PCF_Glyph_Load: glyph index %d\n", glyph_index ));

    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    stream = face->root.stream;

    metric = face->metrics + glyph_index;

    bitmap->rows       = (unsigned int)( metric->ascent +
                                         metric->descent );
    bitmap->width      = (unsigned int)( metric->rightSideBearing -
                                         metric->leftSideBearing );
    bitmap->num_grays  = 1;
    bitmap->pixel_mode = FT_PIXEL_MODE_MONO;

    switch ( PCF_GLYPH_PAD( face->bitmapsFormat ) )
    {
    case 1:
      bitmap->pitch = (int)( ( bitmap->width + 7 ) >> 3 );
      break;

    case 2:
      bitmap->pitch = (int)( ( ( bitmap->width + 15 ) >> 4 ) << 1 );
      break;

    case 4:
      bitmap->pitch = (int)( ( ( bitmap->width + 31 ) >> 5 ) << 2 );
      break;

    case 8:
      bitmap->pitch = (int)( ( ( bitmap->width + 63 ) >> 6 ) << 3 );
      break;

    default:
      return FT_THROW( Invalid_File_Format );
    }

    slot->format      = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = metric->leftSideBearing;
    slot->bitmap_top  = metric->ascent;

    slot->metrics.horiAdvance  = (FT_Pos)( metric->characterWidth * 64 );
    slot->metrics.horiBearingX = (FT_Pos)( metric->leftSideBearing * 64 );
    slot->metrics.horiBearingY = (FT_Pos)( metric->ascent * 64 );
    slot->metrics.width        = (FT_Pos)( ( metric->rightSideBearing -
                                             metric->leftSideBearing ) * 64 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows * 64 );

    ft_synthesize_vertical_metrics( &slot->metrics,
                                    ( face->accel.fontAscent +
                                      face->accel.fontDescent ) * 64 );

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      goto Exit;

    /* XXX: to do: are there cases that need repadding the bitmap? */
    bytes = (FT_ULong)bitmap->pitch * bitmap->rows;

    error = ft_glyphslot_alloc_bitmap( slot, (FT_ULong)bytes );
    if ( error )
      goto Exit;

    if ( FT_STREAM_SEEK( metric->bits )          ||
         FT_STREAM_READ( bitmap->buffer, bytes ) )
      goto Exit;

    if ( PCF_BIT_ORDER( face->bitmapsFormat ) != MSBFirst )
      BitOrderInvert( bitmap->buffer, bytes );

    if ( ( PCF_BYTE_ORDER( face->bitmapsFormat ) !=
           PCF_BIT_ORDER( face->bitmapsFormat )  ) )
    {
      switch ( PCF_SCAN_UNIT( face->bitmapsFormat ) )
      {
      case 1:
        break;

      case 2:
        TwoByteSwap( bitmap->buffer, bytes );
        break;

      case 4:
        FourByteSwap( bitmap->buffer, bytes );
        break;
      }
    }

  Exit:
    return error;
  }